

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

void __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::push
          (UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_> *this,
          pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item)

{
  mapped_type *pmVar1;
  UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_> *this_local;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item_local;
  
  this_local = (UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_> *
               )item.first;
  item_local.first._0_4_ = item.second;
  std::
  queue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::deque<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_std::allocator<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>_>
  ::push(&this->data,(value_type *)&this_local);
  pmVar1 = std::
           unordered_map<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long,_std::hash<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::equal_to<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>,_unsigned_long>_>_>
           ::operator[](&this->count,(key_type *)&this_local);
  *pmVar1 = *pmVar1 + 1;
  return;
}

Assistant:

void push(T item) {
    data.push(item);
    count[item]++;
  }